

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::print(Sudoku *this)

{
  int local_18;
  int local_14;
  int x;
  int y;
  Sudoku *this_local;
  
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
      if (((uint)(this->s).pole[local_14 * 9 + local_18] & 0xf) == 0) {
        std::operator<<((ostream *)&std::cout,".");
      }
      else {
        std::ostream::operator<<
                  ((ostream *)&std::cout,
                   (uint)(*(byte *)((this->s).pole + (local_14 * 9 + local_18)) & 0xf));
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Sudoku::print( void )
{
  for(int y=0;y<9;y++)
  {
    for(int x=0;x<9;x++)
    {
      if (s.pole[y*9+x].zapsane)
        cout<< s.pole[y*9+x].zapsane;
      else
        cout<< ".";
    } 
    cout << endl;
  }
   cout << endl;
}